

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_>::
findBucketWithHash<ReplaceExtraCompilerCacheKey>
          (Data<QHashPrivate::Node<ReplaceExtraCompilerCacheKey,_QString>_> *this,
          ReplaceExtraCompilerCacheKey *key,size_t hash)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  Bucket BVar3;
  Bucket local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->numBuckets - 1 & hash;
  local_30.span = this->spans + (uVar2 >> 7);
  local_30.index = (size_t)((uint)uVar2 & 0x7f);
  while (((ulong)(local_30.span)->offsets[local_30.index] != 0xff &&
         (bVar1 = ReplaceExtraCompilerCacheKey::operator==
                            ((ReplaceExtraCompilerCacheKey *)
                             ((local_30.span)->entries + (local_30.span)->offsets[local_30.index]),
                             key), !bVar1))) {
    Bucket::advanceWrapped(&local_30,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  BVar3.index = local_30.index;
  BVar3.span = local_30.span;
  return BVar3;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }